

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  bool local_119;
  undefined1 local_118 [7];
  bool value_20;
  string value_19;
  bool local_ee;
  bool local_ed;
  int32_t value_18;
  bool value_17;
  int32_t iStack_e8;
  bool value_16;
  int32_t value_15;
  int32_t value_14;
  bool value_13;
  bool value_12;
  bool value_11;
  string value_10;
  undefined1 local_b8 [7];
  bool value_9;
  string value_8;
  string value_7;
  undefined1 local_70 [6];
  bool value_6;
  bool value_5;
  string value_4;
  undefined1 local_40 [8];
  string value_3;
  bool value_2;
  bool value_1;
  bool value;
  char *arg_local;
  
  value_3.field_2._M_local_buf[0xf] = FLAGS_gtest_also_run_disabled_tests & 1;
  bVar1 = ParseFlag(arg,"also_run_disabled_tests",(bool *)(value_3.field_2._M_local_buf + 0xf));
  if (bVar1) {
    FLAGS_gtest_also_run_disabled_tests = value_3.field_2._M_local_buf[0xf] & 1;
    arg_local._7_1_ = 1;
  }
  else {
    value_3.field_2._M_local_buf[0xe] = FLAGS_gtest_break_on_failure & 1;
    bVar1 = ParseFlag(arg,"break_on_failure",(bool *)(value_3.field_2._M_local_buf + 0xe));
    if (bVar1) {
      FLAGS_gtest_break_on_failure = value_3.field_2._M_local_buf[0xe] & 1;
      arg_local._7_1_ = 1;
    }
    else {
      value_3.field_2._M_local_buf[0xd] = FLAGS_gtest_catch_exceptions & 1;
      bVar1 = ParseFlag(arg,"catch_exceptions",(bool *)(value_3.field_2._M_local_buf + 0xd));
      if (bVar1) {
        FLAGS_gtest_catch_exceptions = value_3.field_2._M_local_buf[0xd] & 1;
        arg_local._7_1_ = 1;
      }
      else {
        std::__cxx11::string::string
                  ((string *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   FLAGS_gtest_color_abi_cxx11_);
        value_4.field_2._M_local_buf[8] =
             ParseFlag<std::__cxx11::string>
                       (arg,"color",
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
        if ((bool)value_4.field_2._M_local_buf[8]) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_color_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
          arg_local._7_1_ = 1;
        }
        value_4.field_2._9_3_ = 0;
        std::__cxx11::string::~string((string *)local_40);
        if (value_4.field_2._8_4_ == 0) {
          std::__cxx11::string::string
                    ((string *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
          bVar1 = ParseFlag<std::__cxx11::string>
                            (arg,"death_test_style",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_70);
          if (bVar1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      FLAGS_gtest_death_test_style_abi_cxx11_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70)
            ;
            arg_local._7_1_ = 1;
          }
          value_4.field_2._9_3_ = 0;
          value_4.field_2._M_local_buf[8] = bVar1;
          std::__cxx11::string::~string((string *)local_70);
          if (value_4.field_2._8_4_ == 0) {
            value_7.field_2._M_local_buf[0xf] = FLAGS_gtest_death_test_use_fork & 1;
            bVar1 = ParseFlag(arg,"death_test_use_fork",(bool *)(value_7.field_2._M_local_buf + 0xf)
                             );
            if (bVar1) {
              FLAGS_gtest_death_test_use_fork = value_7.field_2._M_local_buf[0xf] & 1;
              arg_local._7_1_ = 1;
            }
            else {
              value_7.field_2._M_local_buf[0xe] = FLAGS_gtest_fail_fast & 1;
              bVar1 = ParseFlag(arg,"fail_fast",(bool *)(value_7.field_2._M_local_buf + 0xe));
              if (bVar1) {
                FLAGS_gtest_fail_fast = value_7.field_2._M_local_buf[0xe] & 1;
                arg_local._7_1_ = 1;
              }
              else {
                std::__cxx11::string::string
                          ((string *)(value_8.field_2._M_local_buf + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           FLAGS_gtest_filter_abi_cxx11_);
                bVar1 = ParseFlag<std::__cxx11::string>
                                  (arg,"filter",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(value_8.field_2._M_local_buf + 8));
                if (bVar1) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_filter_abi_cxx11_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&value_8.field_2 + 8));
                  arg_local._7_1_ = 1;
                }
                value_4.field_2._9_3_ = 0;
                value_4.field_2._M_local_buf[8] = bVar1;
                std::__cxx11::string::~string((string *)(value_8.field_2._M_local_buf + 8));
                if (value_4.field_2._8_4_ == 0) {
                  std::__cxx11::string::string
                            ((string *)local_b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             FLAGS_gtest_internal_run_death_test_abi_cxx11_);
                  bVar1 = ParseFlag<std::__cxx11::string>
                                    (arg,"internal_run_death_test",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_b8);
                  if (bVar1) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )FLAGS_gtest_internal_run_death_test_abi_cxx11_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8);
                    arg_local._7_1_ = 1;
                  }
                  value_4.field_2._9_3_ = 0;
                  value_4.field_2._M_local_buf[8] = bVar1;
                  std::__cxx11::string::~string((string *)local_b8);
                  if (value_4.field_2._8_4_ == 0) {
                    value_10.field_2._M_local_buf[0xf] = FLAGS_gtest_list_tests & 1;
                    bVar1 = ParseFlag(arg,"list_tests",(bool *)(value_10.field_2._M_local_buf + 0xf)
                                     );
                    if (bVar1) {
                      FLAGS_gtest_list_tests = value_10.field_2._M_local_buf[0xf] & 1;
                      arg_local._7_1_ = 1;
                    }
                    else {
                      std::__cxx11::string::string
                                ((string *)&value_14,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)FLAGS_gtest_output_abi_cxx11_);
                      bVar1 = ParseFlag<std::__cxx11::string>
                                        (arg,"output",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&value_14);
                      if (bVar1) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)FLAGS_gtest_output_abi_cxx11_,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&value_14);
                        arg_local._7_1_ = 1;
                      }
                      value_4.field_2._9_3_ = 0;
                      value_4.field_2._M_local_buf[8] = bVar1;
                      std::__cxx11::string::~string((string *)&value_14);
                      if (value_4.field_2._8_4_ == 0) {
                        value_15._3_1_ = FLAGS_gtest_brief & 1;
                        bVar1 = ParseFlag(arg,"brief",(bool *)((long)&value_15 + 3));
                        if (bVar1) {
                          FLAGS_gtest_brief = value_15._3_1_ & 1;
                          arg_local._7_1_ = 1;
                        }
                        else {
                          value_15._2_1_ = FLAGS_gtest_print_time & 1;
                          bVar1 = ParseFlag(arg,"print_time",(bool *)((long)&value_15 + 2));
                          if (bVar1) {
                            FLAGS_gtest_print_time = value_15._2_1_ & 1;
                            arg_local._7_1_ = 1;
                          }
                          else {
                            value_15._1_1_ = FLAGS_gtest_print_utf8 & 1;
                            bVar1 = ParseFlag(arg,"print_utf8",(bool *)((long)&value_15 + 1));
                            if (bVar1) {
                              FLAGS_gtest_print_utf8 = value_15._1_1_ & 1;
                              arg_local._7_1_ = 1;
                            }
                            else {
                              iStack_e8 = FLAGS_gtest_random_seed;
                              bVar1 = ParseFlag(arg,"random_seed",&stack0xffffffffffffff18);
                              if (bVar1) {
                                FLAGS_gtest_random_seed = iStack_e8;
                                arg_local._7_1_ = 1;
                              }
                              else {
                                value_18 = FLAGS_gtest_repeat;
                                bVar1 = ParseFlag(arg,"repeat",&value_18);
                                if (bVar1) {
                                  FLAGS_gtest_repeat = value_18;
                                  arg_local._7_1_ = 1;
                                }
                                else {
                                  local_ed = (bool)(FLAGS_gtest_recreate_environments_when_repeating
                                                   & 1);
                                  bVar1 = ParseFlag(arg,"recreate_environments_when_repeating",
                                                    &local_ed);
                                  if (bVar1) {
                                    FLAGS_gtest_recreate_environments_when_repeating = local_ed & 1;
                                    arg_local._7_1_ = 1;
                                  }
                                  else {
                                    local_ee = (bool)(FLAGS_gtest_shuffle & 1);
                                    bVar1 = ParseFlag(arg,"shuffle",&local_ee);
                                    if (bVar1) {
                                      FLAGS_gtest_shuffle = local_ee & 1;
                                      arg_local._7_1_ = 1;
                                    }
                                    else {
                                      value_19.field_2._12_4_ = FLAGS_gtest_stack_trace_depth;
                                      bVar1 = ParseFlag(arg,"stack_trace_depth",
                                                        (int32_t *)
                                                        (value_19.field_2._M_local_buf + 0xc));
                                      if (bVar1) {
                                        FLAGS_gtest_stack_trace_depth = value_19.field_2._12_4_;
                                        arg_local._7_1_ = 1;
                                      }
                                      else {
                                        std::__cxx11::string::string
                                                  ((string *)local_118,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)FLAGS_gtest_stream_result_to_abi_cxx11_);
                                        bVar1 = ParseFlag<std::__cxx11::string>
                                                          (arg,"stream_result_to",
                                                           (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118);
                                        if (bVar1) {
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::operator=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)FLAGS_gtest_stream_result_to_abi_cxx11_,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118);
                                          arg_local._7_1_ = 1;
                                        }
                                        value_4.field_2._9_3_ = 0;
                                        value_4.field_2._M_local_buf[8] = bVar1;
                                        std::__cxx11::string::~string((string *)local_118);
                                        if (value_4.field_2._8_4_ == 0) {
                                          local_119 = (bool)(FLAGS_gtest_throw_on_failure & 1);
                                          bVar1 = ParseFlag(arg,"throw_on_failure",&local_119);
                                          if (bVar1) {
                                            FLAGS_gtest_throw_on_failure = local_119 & 1;
                                            arg_local._7_1_ = 1;
                                          }
                                          else {
                                            arg_local._7_1_ = 0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(arg_local._7_1_ & 1);
}

Assistant:

static bool ParseGoogleTestFlag(const char* const arg) {
#define GTEST_INTERNAL_PARSE_FLAG(flag_name)  \
  do {                                        \
    auto value = GTEST_FLAG_GET(flag_name);   \
    if (ParseFlag(arg, #flag_name, &value)) { \
      GTEST_FLAG_SET(flag_name, value);       \
      return true;                            \
    }                                         \
  } while (false)

  GTEST_INTERNAL_PARSE_FLAG(also_run_disabled_tests);
  GTEST_INTERNAL_PARSE_FLAG(break_on_failure);
  GTEST_INTERNAL_PARSE_FLAG(catch_exceptions);
  GTEST_INTERNAL_PARSE_FLAG(color);
  GTEST_INTERNAL_PARSE_FLAG(death_test_style);
  GTEST_INTERNAL_PARSE_FLAG(death_test_use_fork);
  GTEST_INTERNAL_PARSE_FLAG(fail_fast);
  GTEST_INTERNAL_PARSE_FLAG(filter);
  GTEST_INTERNAL_PARSE_FLAG(internal_run_death_test);
  GTEST_INTERNAL_PARSE_FLAG(list_tests);
  GTEST_INTERNAL_PARSE_FLAG(output);
  GTEST_INTERNAL_PARSE_FLAG(brief);
  GTEST_INTERNAL_PARSE_FLAG(print_time);
  GTEST_INTERNAL_PARSE_FLAG(print_utf8);
  GTEST_INTERNAL_PARSE_FLAG(random_seed);
  GTEST_INTERNAL_PARSE_FLAG(repeat);
  GTEST_INTERNAL_PARSE_FLAG(recreate_environments_when_repeating);
  GTEST_INTERNAL_PARSE_FLAG(shuffle);
  GTEST_INTERNAL_PARSE_FLAG(stack_trace_depth);
  GTEST_INTERNAL_PARSE_FLAG(stream_result_to);
  GTEST_INTERNAL_PARSE_FLAG(throw_on_failure);
  return false;
}